

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_read_blocks(lzh_stream *strm,wchar_t last)

{
  ushort uVar1;
  lzh_dec *plVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  lzh_br *br_00;
  wchar_t n;
  uint rbits;
  wchar_t i;
  wchar_t c;
  lzh_br *br;
  lzh_dec *ds;
  wchar_t last_local;
  lzh_stream *strm_local;
  
  plVar2 = strm->ds;
  br_00 = &plVar2->br;
switchD_001964b4_default:
  switch(plVar2->state) {
  case L'\0':
    if (((plVar2->br).cache_avail < L'\x10') && (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0'))
    {
      if (last == L'\0') {
        return L'\0';
      }
      if ((plVar2->br).cache_avail < L'\b') {
        if (L'\0' < plVar2->w_pos) {
          lzh_emit_window(strm,(long)plVar2->w_pos);
          plVar2->w_pos = L'\0';
          return L'\0';
        }
        return L'\x01';
      }
      goto LAB_00196e9f;
    }
    plVar2->blocks_avail =
         (uint)(br_00->cache_buffer >> ((char)(plVar2->br).cache_avail - 0x10U & 0x3f)) & 0xffff;
    if (plVar2->blocks_avail == L'\0') goto LAB_00196e9f;
    (plVar2->br).cache_avail = (plVar2->br).cache_avail + L'\xfffffff0';
    (plVar2->pt).len_size = plVar2->literal_pt_len_size;
    (plVar2->pt).len_bits = plVar2->literal_pt_len_bits;
    plVar2->reading_position = L'\0';
    break;
  case L'\x02':
    goto switchD_001964b4_caseD_2;
  case L'\x03':
    goto switchD_001964b4_caseD_3;
  case L'\x04':
    goto switchD_001964b4_caseD_4;
  case L'\x05':
    goto switchD_001964b4_caseD_5;
  case L'\x06':
    goto switchD_001964b4_caseD_6;
  case L'\a':
    goto switchD_001964b4_caseD_7;
  case L'\b':
    goto switchD_001964b4_caseD_8;
  case L'\t':
    goto LAB_00196eb4;
  default:
    goto switchD_001964b4_default;
  }
  if ((((plVar2->br).cache_avail < (plVar2->pt).len_bits) &&
      (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
     ((plVar2->br).cache_avail < (plVar2->pt).len_bits)) {
    if (last == L'\0') {
      plVar2->state = L'\x01';
      return L'\0';
    }
  }
  else {
    (plVar2->pt).len_avail =
         (uint)(br_00->cache_buffer >>
               ((char)(plVar2->br).cache_avail - (char)(plVar2->pt).len_bits & 0x3fU)) & 0xffff &
         (uint)cache_masks[(plVar2->pt).len_bits];
    (plVar2->br).cache_avail = (plVar2->br).cache_avail - (plVar2->pt).len_bits;
switchD_001964b4_caseD_2:
    if ((plVar2->pt).len_avail == L'\0') {
      if ((((plVar2->br).cache_avail < (plVar2->pt).len_bits) &&
          (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
         ((plVar2->br).cache_avail < (plVar2->pt).len_bits)) {
        if (last == L'\0') {
          plVar2->state = L'\x02';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      wVar3 = lzh_make_fake_table(&plVar2->pt,
                                  (ushort)(br_00->cache_buffer >>
                                          ((char)(plVar2->br).cache_avail -
                                           (char)(plVar2->pt).len_bits & 0x3fU)) &
                                  cache_masks[(plVar2->pt).len_bits]);
      if (wVar3 != L'\0') {
        (plVar2->br).cache_avail = (plVar2->br).cache_avail - (plVar2->pt).len_bits;
        if (plVar2->reading_position == L'\0') {
          plVar2->state = L'\x05';
        }
        else {
          plVar2->state = L'\t';
        }
        goto switchD_001964b4_default;
      }
    }
    else {
      if ((plVar2->pt).len_size < (plVar2->pt).len_avail) goto LAB_00196e9f;
      plVar2->loop = L'\0';
      memset((plVar2->pt).freq,0,0x44);
      if (((plVar2->pt).len_avail < L'\x03') || ((plVar2->pt).len_size == plVar2->pos_pt_len_size))
      {
        plVar2->state = L'\x04';
        goto switchD_001964b4_default;
      }
switchD_001964b4_caseD_3:
      wVar3 = lzh_read_pt_bitlen(strm,plVar2->loop,L'\x03');
      plVar2->loop = wVar3;
      if (plVar2->loop < L'\x03') {
        if ((L'\xffffffff' < plVar2->loop) && (last == L'\0')) {
          plVar2->state = L'\x03';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      if ((((plVar2->br).cache_avail < L'\x02') &&
          (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
         ((plVar2->br).cache_avail < L'\x02')) {
        if (last == L'\0') {
          plVar2->state = L'\x03';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      rbits = (uint)(br_00->cache_buffer >> ((char)(plVar2->br).cache_avail - 2U & 0x3f)) & 3;
      (plVar2->br).cache_avail = (plVar2->br).cache_avail + L'\xfffffffe';
      if ((plVar2->pt).len_avail + L'\xfffffffd' < (int)rbits) goto LAB_00196e9f;
      n = L'\x03';
      while (0 < (int)rbits) {
        (plVar2->pt).bitlen[n] = '\0';
        n = n + L'\x01';
        rbits = rbits - 1;
      }
      plVar2->loop = n;
switchD_001964b4_caseD_4:
      wVar3 = lzh_read_pt_bitlen(strm,plVar2->loop,(plVar2->pt).len_avail);
      plVar2->loop = wVar3;
      if (plVar2->loop < (plVar2->pt).len_avail) {
        if ((L'\xffffffff' < plVar2->loop) && (last == L'\0')) {
          plVar2->state = L'\x04';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      wVar3 = lzh_make_huffman_table(&plVar2->pt);
      if (wVar3 == L'\0') goto LAB_00196e9f;
      if (plVar2->reading_position != L'\0') {
        plVar2->state = L'\t';
        goto switchD_001964b4_default;
      }
switchD_001964b4_caseD_5:
      if ((((plVar2->br).cache_avail < (plVar2->lt).len_bits) &&
          (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
         ((plVar2->br).cache_avail < (plVar2->lt).len_bits)) {
        if (last == L'\0') {
          plVar2->state = L'\x05';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      (plVar2->lt).len_avail =
           (uint)(br_00->cache_buffer >>
                 ((char)(plVar2->br).cache_avail - (char)(plVar2->lt).len_bits & 0x3fU)) & 0xffff &
           (uint)cache_masks[(plVar2->lt).len_bits];
      (plVar2->br).cache_avail = (plVar2->br).cache_avail - (plVar2->lt).len_bits;
switchD_001964b4_caseD_6:
      if ((plVar2->lt).len_avail != L'\0') {
        if ((plVar2->lt).len_size < (plVar2->lt).len_avail) goto LAB_00196e9f;
        plVar2->loop = L'\0';
        memset((plVar2->lt).freq,0,0x44);
switchD_001964b4_caseD_7:
        n = plVar2->loop;
        while (n < (plVar2->lt).len_avail) {
          if ((((plVar2->br).cache_avail < (plVar2->pt).max_bits) &&
              (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
             ((plVar2->br).cache_avail < (plVar2->pt).max_bits)) {
            if (last == L'\0') {
              plVar2->loop = n;
              plVar2->state = L'\a';
              return L'\0';
            }
            goto LAB_00196e9f;
          }
          wVar3 = lzh_decode_huffman(&plVar2->pt,
                                     (uint)(br_00->cache_buffer >>
                                           ((char)(plVar2->br).cache_avail -
                                            (char)(plVar2->pt).max_bits & 0x3fU)) & 0xffff &
                                     (uint)cache_masks[(plVar2->pt).max_bits]);
          if (wVar3 < L'\x03') {
            if (wVar3 == L'\0') {
              (plVar2->br).cache_avail = (plVar2->br).cache_avail - (uint)*(plVar2->pt).bitlen;
              (plVar2->lt).bitlen[n] = '\0';
              n = n + L'\x01';
            }
            else {
              iVar4 = 9;
              if (wVar3 == L'\x01') {
                iVar4 = 4;
              }
              if ((((plVar2->br).cache_avail < (int)((uint)(plVar2->pt).bitlen[wVar3] + iVar4)) &&
                  (wVar5 = lzh_br_fillup(strm,br_00), wVar5 == L'\0')) &&
                 ((plVar2->br).cache_avail < (int)((uint)(plVar2->pt).bitlen[wVar3] + iVar4))) {
                if (last == L'\0') {
                  plVar2->loop = n;
                  plVar2->state = L'\a';
                  return L'\0';
                }
                goto LAB_00196e9f;
              }
              (plVar2->br).cache_avail = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[wVar3]
              ;
              wVar3 = (plVar2->br).cache_avail;
              uVar1 = cache_masks[iVar4];
              (plVar2->br).cache_avail = (plVar2->br).cache_avail - iVar4;
              iVar6 = 0x14;
              if (iVar4 == 4) {
                iVar6 = 3;
              }
              iVar6 = iVar6 + ((uint)(br_00->cache_buffer >> ((char)wVar3 - (char)iVar4 & 0x3fU)) &
                               0xffff & (uint)uVar1);
              if ((plVar2->lt).len_avail < n + iVar6) goto LAB_00196e9f;
              memset((plVar2->lt).bitlen + n,0,(long)iVar6);
              n = iVar6 + n;
            }
          }
          else {
            (plVar2->br).cache_avail = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[wVar3];
            iVar4 = wVar3 + L'\xfffffffe';
            (plVar2->lt).freq[iVar4] = (plVar2->lt).freq[iVar4] + L'\x01';
            (plVar2->lt).bitlen[n] = (uchar)iVar4;
            n = n + L'\x01';
          }
        }
        if (((plVar2->lt).len_avail < n) ||
           (wVar3 = lzh_make_huffman_table(&plVar2->lt), wVar3 == L'\0')) goto LAB_00196e9f;
switchD_001964b4_caseD_8:
        (plVar2->pt).len_size = plVar2->pos_pt_len_size;
        (plVar2->pt).len_bits = plVar2->pos_pt_len_bits;
        plVar2->reading_position = L'\x01';
        plVar2->state = L'\x01';
        goto switchD_001964b4_default;
      }
      if ((((plVar2->br).cache_avail < (plVar2->lt).len_bits) &&
          (wVar3 = lzh_br_fillup(strm,br_00), wVar3 == L'\0')) &&
         ((plVar2->br).cache_avail < (plVar2->lt).len_bits)) {
        if (last == L'\0') {
          plVar2->state = L'\x06';
          return L'\0';
        }
        goto LAB_00196e9f;
      }
      wVar3 = lzh_make_fake_table(&plVar2->lt,
                                  (ushort)(br_00->cache_buffer >>
                                          ((char)(plVar2->br).cache_avail -
                                           (char)(plVar2->lt).len_bits & 0x3fU)) &
                                  cache_masks[(plVar2->lt).len_bits]);
      if (wVar3 != L'\0') {
        (plVar2->br).cache_avail = (plVar2->br).cache_avail - (plVar2->lt).len_bits;
        plVar2->state = L'\b';
        goto switchD_001964b4_default;
      }
    }
  }
LAB_00196e9f:
  plVar2->error = L'\xffffffe7';
  return L'\xffffffe7';
LAB_00196eb4:
  return L'd';
}

Assistant:

static int
lzh_read_blocks(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br *br = &(ds->br);
	int c = 0, i;
	unsigned rbits;

	for (;;) {
		switch (ds->state) {
		case ST_RD_BLOCK:
			/*
			 * Read a block number indicates how many blocks
			 * we will handle. The block is composed of a
			 * literal and a match, sometimes a literal only
			 * in particular, there are no reference data at
			 * the beginning of the decompression.
			 */
			if (!lzh_br_read_ahead_0(strm, br, 16)) {
				if (!last)
					/* We need following data. */
					return (ARCHIVE_OK);
				if (lzh_br_has(br, 8)) {
					/*
					 * It seems there are extra bits.
					 *  1. Compressed data is broken.
					 *  2. `last' flag does not properly
					 *     set.
					 */
					goto failed;
				}
				if (ds->w_pos > 0) {
					lzh_emit_window(strm, ds->w_pos);
					ds->w_pos = 0;
					return (ARCHIVE_OK);
				}
				/* End of compressed data; we have completely
				 * handled all compressed data. */
				return (ARCHIVE_EOF);
			}
			ds->blocks_avail = lzh_br_bits(br, 16);
			if (ds->blocks_avail == 0)
				goto failed;
			lzh_br_consume(br, 16);
			/*
			 * Read a literal table compressed in huffman
			 * coding.
			 */
			ds->pt.len_size = ds->literal_pt_len_size;
			ds->pt.len_bits = ds->literal_pt_len_bits;
			ds->reading_position = 0;
			/* FALL THROUGH */
		case ST_RD_PT_1:
			/* Note: ST_RD_PT_1, ST_RD_PT_2 and ST_RD_PT_4 are
			 * used in reading both a literal table and a
			 * position table. */
			if (!lzh_br_read_ahead(strm, br, ds->pt.len_bits)) {
				if (last)
					goto failed;/* Truncated data. */
				ds->state = ST_RD_PT_1;
				return (ARCHIVE_OK);
			}
			ds->pt.len_avail = lzh_br_bits(br, ds->pt.len_bits);
			lzh_br_consume(br, ds->pt.len_bits);
			/* FALL THROUGH */
		case ST_RD_PT_2:
			if (ds->pt.len_avail == 0) {
				/* There is no bitlen. */
				if (!lzh_br_read_ahead(strm, br,
				    ds->pt.len_bits)) {
					if (last)
						goto failed;/* Truncated data.*/
					ds->state = ST_RD_PT_2;
					return (ARCHIVE_OK);
				}
				if (!lzh_make_fake_table(&(ds->pt),
				    lzh_br_bits(br, ds->pt.len_bits)))
					goto failed;/* Invalid data. */
				lzh_br_consume(br, ds->pt.len_bits);
				if (ds->reading_position)
					ds->state = ST_GET_LITERAL;
				else
					ds->state = ST_RD_LITERAL_1;
				break;
			} else if (ds->pt.len_avail > ds->pt.len_size)
				goto failed;/* Invalid data. */
			ds->loop = 0;
			memset(ds->pt.freq, 0, sizeof(ds->pt.freq));
			if (ds->pt.len_avail < 3 ||
			    ds->pt.len_size == ds->pos_pt_len_size) {
				ds->state = ST_RD_PT_4;
				break;
			}
			/* FALL THROUGH */
		case ST_RD_PT_3:
			ds->loop = lzh_read_pt_bitlen(strm, ds->loop, 3);
			if (ds->loop < 3) {
				if (ds->loop < 0 || last)
					goto failed;/* Invalid data. */
				/* Not completed, get following data. */
				ds->state = ST_RD_PT_3;
				return (ARCHIVE_OK);
			}
			/* There are some null in bitlen of the literal. */
			if (!lzh_br_read_ahead(strm, br, 2)) {
				if (last)
					goto failed;/* Truncated data. */
				ds->state = ST_RD_PT_3;
				return (ARCHIVE_OK);
			}
			c = lzh_br_bits(br, 2);
			lzh_br_consume(br, 2);
			if (c > ds->pt.len_avail - 3)
				goto failed;/* Invalid data. */
			for (i = 3; c-- > 0 ;)
				ds->pt.bitlen[i++] = 0;
			ds->loop = i;
			/* FALL THROUGH */
		case ST_RD_PT_4:
			ds->loop = lzh_read_pt_bitlen(strm, ds->loop,
			    ds->pt.len_avail);
			if (ds->loop < ds->pt.len_avail) {
				if (ds->loop < 0 || last)
					goto failed;/* Invalid data. */
				/* Not completed, get following data. */
				ds->state = ST_RD_PT_4;
				return (ARCHIVE_OK);
			}
			if (!lzh_make_huffman_table(&(ds->pt)))
				goto failed;/* Invalid data */
			if (ds->reading_position) {
				ds->state = ST_GET_LITERAL;
				break;
			}
			/* FALL THROUGH */
		case ST_RD_LITERAL_1:
			if (!lzh_br_read_ahead(strm, br, ds->lt.len_bits)) {
				if (last)
					goto failed;/* Truncated data. */
				ds->state = ST_RD_LITERAL_1;
				return (ARCHIVE_OK);
			}
			ds->lt.len_avail = lzh_br_bits(br, ds->lt.len_bits);
			lzh_br_consume(br, ds->lt.len_bits);
			/* FALL THROUGH */
		case ST_RD_LITERAL_2:
			if (ds->lt.len_avail == 0) {
				/* There is no bitlen. */
				if (!lzh_br_read_ahead(strm, br,
				    ds->lt.len_bits)) {
					if (last)
						goto failed;/* Truncated data.*/
					ds->state = ST_RD_LITERAL_2;
					return (ARCHIVE_OK);
				}
				if (!lzh_make_fake_table(&(ds->lt),
				    lzh_br_bits(br, ds->lt.len_bits)))
					goto failed;/* Invalid data */
				lzh_br_consume(br, ds->lt.len_bits);
				ds->state = ST_RD_POS_DATA_1;
				break;
			} else if (ds->lt.len_avail > ds->lt.len_size)
				goto failed;/* Invalid data */
			ds->loop = 0;
			memset(ds->lt.freq, 0, sizeof(ds->lt.freq));
			/* FALL THROUGH */
		case ST_RD_LITERAL_3:
			i = ds->loop;
			while (i < ds->lt.len_avail) {
				if (!lzh_br_read_ahead(strm, br,
				    ds->pt.max_bits)) {
					if (last)
						goto failed;/* Truncated data.*/
					ds->loop = i;
					ds->state = ST_RD_LITERAL_3;
					return (ARCHIVE_OK);
				}
				rbits = lzh_br_bits(br, ds->pt.max_bits);
				c = lzh_decode_huffman(&(ds->pt), rbits);
				if (c > 2) {
					/* Note: 'c' will never be more than
					 * eighteen since it's limited by
					 * PT_BITLEN_SIZE, which is being set
					 * to ds->pt.len_size through
					 * ds->literal_pt_len_size. */
					lzh_br_consume(br, ds->pt.bitlen[c]);
					c -= 2;
					ds->lt.freq[c]++;
					ds->lt.bitlen[i++] = c;
				} else if (c == 0) {
					lzh_br_consume(br, ds->pt.bitlen[c]);
					ds->lt.bitlen[i++] = 0;
				} else {
					/* c == 1 or c == 2 */
					int n = (c == 1)?4:9;
					if (!lzh_br_read_ahead(strm, br,
					     ds->pt.bitlen[c] + n)) {
						if (last) /* Truncated data. */
							goto failed;
						ds->loop = i;
						ds->state = ST_RD_LITERAL_3;
						return (ARCHIVE_OK);
					}
					lzh_br_consume(br, ds->pt.bitlen[c]);
					c = lzh_br_bits(br, n);
					lzh_br_consume(br, n);
					c += (n == 4)?3:20;
					if (i + c > ds->lt.len_avail)
						goto failed;/* Invalid data */
					memset(&(ds->lt.bitlen[i]), 0, c);
					i += c;
				}
			}
			if (i > ds->lt.len_avail ||
			    !lzh_make_huffman_table(&(ds->lt)))
				goto failed;/* Invalid data */
			/* FALL THROUGH */
		case ST_RD_POS_DATA_1:
			/*
			 * Read a position table compressed in huffman
			 * coding.
			 */
			ds->pt.len_size = ds->pos_pt_len_size;
			ds->pt.len_bits = ds->pos_pt_len_bits;
			ds->reading_position = 1;
			ds->state = ST_RD_PT_1;
			break;
		case ST_GET_LITERAL:
			return (100);
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
}